

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::NameCacheTests_test_get_default_Test::TestBody
          (NameCacheTests_test_get_default_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *message;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           bidfx_public_api::tools::NameCache::GetDefault();
  local_28.data_ = (AssertHelperData *)bidfx_public_api::tools::NameCache::GetDefault();
  local_20.ptr_ = pbVar1;
  testing::internal::
  CmpHelperEQ<bidfx_public_api::tools::NameCache*,bidfx_public_api::tools::NameCache*>
            ((internal *)&gtest_ar,"&cache1","&cache2",(NameCache **)&local_20,
             (NameCache **)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/name_cache_test.cpp"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(NameCacheTests, test_get_default)
{
    NameCache& cache1 = NameCache::GetDefault();
    NameCache& cache2 = NameCache::GetDefault();
    EXPECT_EQ(&cache1, &cache2);
}